

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_AddInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  DObject *this;
  char *pcVar2;
  DObject *this_00;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00430c17;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00430bfe:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430c17:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x2f4,
                  "int AF_AActor_AddInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_00430b82;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00430c17;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_00430bfe;
LAB_00430b82:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00430c36;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00430c07:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00430c36;
  }
  this_00 = (DObject *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (this_00 == (DObject *)0x0) goto LAB_00430bab;
  }
  else {
    if (this_00 != (DObject *)0x0) goto LAB_00430c07;
LAB_00430bab:
    NullParam("\"item\"");
    this_00 = (DObject *)param[1].field_0.field_1.a;
    if (this_00 == (DObject *)0x0) {
      this_00 = (DObject *)0x0;
      goto LAB_00430be2;
    }
  }
  bVar1 = DObject::IsKindOf(this_00,AInventory::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar2 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
LAB_00430c36:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x2f5,
                  "int AF_AActor_AddInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00430be2:
  (*this->_vptr_DObject[0x14])(this,this_00);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, AddInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	self->AddInventory(item);
	return 0;
}